

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_proxy_constructor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  int *piVar4;
  int iVar5;
  JSRefCountHeader *p_1;
  JSValueUnion JVar6;
  JSValueUnion *pJVar7;
  ulong uVar8;
  JSObject *p_3;
  JSObject *p_2;
  JSValue val;
  JSValue v;
  JSValue JVar9;
  int local_48;
  
  JVar1 = (JSValueUnion)argv->tag;
  JVar2 = (JSValueUnion)argv[1].tag;
  if (JVar2.int32 == -1 && JVar1.int32 == -1) {
    JVar3 = (JSValueUnion)(argv->u).ptr;
    piVar4 = (int *)argv[1].u.ptr;
    v = JS_NewObjectProtoClass(ctx,(JSValue)(ZEXT816(2) << 0x40),0x29);
    JVar6 = v.u;
    if ((v.tag & 0xffffffffU) != 6) {
      pJVar7 = (JSValueUnion *)js_malloc(ctx,0x28);
      if (pJVar7 == (JSValueUnion *)0x0) {
        JS_FreeValue(ctx,v);
        goto LAB_00129ad5;
      }
      *(int *)JVar3.ptr = *JVar3.ptr + 1;
      pJVar7->ptr = (void *)JVar3;
      pJVar7[1] = JVar1;
      *piVar4 = *piVar4 + 1;
      pJVar7[2].ptr = piVar4;
      pJVar7[3] = JVar2;
      val.tag = (int64_t)JVar1.ptr;
      val.u.ptr = JVar3.ptr;
      iVar5 = JS_IsFunction(ctx,val);
      *(char *)(pJVar7 + 4) = (char)iVar5;
      *(undefined1 *)((long)pJVar7 + 0x21) = 0;
      local_48 = (int)v.tag;
      if (local_48 == -1) {
        *(JSValueUnion **)((long)JVar6.ptr + 0x30) = pJVar7;
        *(byte *)((long)JVar6.ptr + 5) =
             *(byte *)((long)JVar6.ptr + 5) & 0xef | *(byte *)((long)JVar3.ptr + 5) & 0x10;
      }
    }
    uVar8 = (ulong)JVar6.ptr & 0xffffffff00000000;
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
LAB_00129ad5:
    v = (JSValue)(ZEXT816(6) << 0x40);
    uVar8 = 0;
  }
  JVar9.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar8);
  JVar9.tag = v.tag;
  return JVar9;
}

Assistant:

static JSValue js_proxy_constructor(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst target, handler;
    JSValue obj;
    JSProxyData *s;

    target = argv[0];
    handler = argv[1];
    if (JS_VALUE_GET_TAG(target) != JS_TAG_OBJECT ||
        JS_VALUE_GET_TAG(handler) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);

    obj = JS_NewObjectProtoClass(ctx, JS_NULL, JS_CLASS_PROXY);
    if (JS_IsException(obj))
        return obj;
    s = js_malloc(ctx, sizeof(JSProxyData));
    if (!s) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    s->target = JS_DupValue(ctx, target);
    s->handler = JS_DupValue(ctx, handler);
    s->is_func = JS_IsFunction(ctx, target);
    s->is_revoked = FALSE;
    JS_SetOpaque(obj, s);
    JS_SetConstructorBit(ctx, obj, JS_IsConstructor(ctx, target));
    return obj;
}